

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winfnt.c
# Opt level: O2

void FNT_Face_Done(FT_Face fntface)

{
  FT_Memory memory;
  FNT_Face face;
  
  if (fntface != (FT_Face)0x0) {
    memory = fntface->memory;
    fnt_font_done((FNT_Face)fntface);
    ft_mem_free(memory,fntface->available_sizes);
    fntface->available_sizes = (FT_Bitmap_Size *)0x0;
    fntface->num_fixed_sizes = 0;
  }
  return;
}

Assistant:

static void
  FNT_Face_Done( FT_Face  fntface )       /* FNT_Face */
  {
    FNT_Face   face = (FNT_Face)fntface;
    FT_Memory  memory;


    if ( !face )
      return;

    memory = FT_FACE_MEMORY( face );

    fnt_font_done( face );

    FT_FREE( fntface->available_sizes );
    fntface->num_fixed_sizes = 0;
  }